

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv64_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  secp256k1_scalar *a;
  ushort *puVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int64_t iVar12;
  int64_t iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar17;
  uint64_t uVar18;
  long lVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar24;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar25;
  long lVar26;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar27;
  uint uVar28;
  long lVar29;
  secp256k1_modinv64_modinfo *psVar31;
  int *piVar32;
  secp256k1_modinv32_signed30 *psVar33;
  ulong uVar34;
  uint64_t uVar35;
  ulong uVar36;
  ulong uVar37;
  secp256k1_modinv32_signed30 *psVar38;
  secp256k1_fe *psVar39;
  ulong uVar40;
  secp256k1_fe *r;
  uint uVar41;
  secp256k1_modinv64_modinfo *psVar42;
  secp256k1_modinv64_modinfo *psVar43;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar44;
  ulong uVar45;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar46;
  uchar *__s;
  uint uVar47;
  ulong uVar48;
  uint uVar49;
  secp256k1_modinv64_modinfo *psVar50;
  ulong uVar51;
  int *piVar52;
  char cVar53;
  uint uVar54;
  secp256k1_modinv64_modinfo *psVar55;
  secp256k1_modinv32_signed30 *psVar56;
  uint uVar57;
  code *pcVar58;
  secp256k1_modinv32_signed30 *psVar59;
  size_t count;
  uint uVar60;
  uint64_t uVar61;
  secp256k1_fe *a_03;
  uint uVar62;
  uint uVar63;
  secp256k1_modinv64_modinfo *psVar64;
  uint64_t uVar65;
  bool bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  secp256k1_modinv64_signed62 x;
  secp256k1_modinv64_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  ulong uStack_1738;
  secp256k1_fe *psStack_1730;
  uchar auStack_1728 [4232];
  secp256k1_fe *psStack_6a0;
  ulong uStack_698;
  uint64_t uStack_690;
  secp256k1_fe *psStack_688;
  code *pcStack_680;
  code *pcStack_678;
  undefined1 auStack_670 [36];
  int iStack_64c;
  int iStack_648;
  int iStack_644;
  int iStack_640;
  int iStack_63c;
  int iStack_638;
  int iStack_634;
  undefined1 auStack_630 [48];
  code *pcStack_600;
  long lStack_5f0;
  secp256k1_fe sStack_5e8;
  secp256k1_fe *psStack_5b0;
  secp256k1_fe sStack_5a8;
  secp256k1_fe sStack_578;
  ulong uStack_540;
  ulong uStack_538;
  ulong uStack_530;
  secp256k1_modinv32_signed30 *psStack_528;
  ulong uStack_520;
  code *pcStack_518;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint uStack_500;
  uint uStack_4fc;
  secp256k1_modinv32_signed30 *psStack_4f8;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  uint uStack_4e0;
  int32_t iStack_4dc;
  secp256k1_modinv32_signed30 *psStack_4d8;
  secp256k1_modinv32_signed30 *psStack_4d0;
  secp256k1_modinv32_signed30 *psStack_4c8;
  secp256k1_modinv32_signed30 *psStack_4c0;
  secp256k1_modinv32_signed30 *psStack_4b8;
  code *pcStack_4b0;
  long lStack_4a0;
  long lStack_498;
  int *piStack_490;
  ulong uStack_488;
  secp256k1_modinv64_modinfo *psStack_480;
  secp256k1_modinv64_modinfo *psStack_470;
  code *pcStack_468;
  secp256k1_modinv32_signed30 *psStack_460;
  int *piStack_450;
  ulong uStack_448;
  secp256k1_modinv64_modinfo *psStack_440;
  secp256k1_modinv64_modinfo *psStack_430;
  code *pcStack_428;
  secp256k1_modinv32_signed30 sStack_420;
  secp256k1_modinv32_signed30 sStack_3fc;
  secp256k1_modinv64_modinfo *psStack_3d8;
  secp256k1_modinv64_modinfo *psStack_3d0;
  secp256k1_modinv64_modinfo *psStack_3c0;
  int iStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  secp256k1_modinv32_trans2x2 sStack_3a8;
  secp256k1_modinv64_modinfo sStack_398;
  long lStack_368;
  undefined8 uStack_360;
  secp256k1_modinv64_modinfo sStack_358;
  undefined1 auStack_328 [40];
  uint64_t uStack_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  secp256k1_modinv64_modinfo *psStack_2e0;
  ulong uStack_2d8;
  secp256k1_modinv64_modinfo *psStack_2d0;
  secp256k1_modinv64_modinfo *psStack_2c8;
  secp256k1_modinv64_modinfo *psStack_2c0;
  secp256k1_modinv64_modinfo *psStack_2b8;
  int iStack_2ac;
  secp256k1_modinv64_modinfo *psStack_2a8;
  secp256k1_modinv32_trans2x2 sStack_2a0;
  secp256k1_modinv64_modinfo sStack_290;
  secp256k1_modinv64_modinfo *psStack_260;
  undefined8 uStack_258;
  secp256k1_modinv64_modinfo sStack_250;
  undefined1 auStack_220 [40];
  uint64_t uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  secp256k1_modinv64_modinfo *psStack_1d8;
  secp256k1_modinv64_modinfo *psStack_1d0;
  secp256k1_modinv64_modinfo *psStack_1c8;
  secp256k1_modinv64_modinfo *psStack_1c0;
  secp256k1_modinv64_modinfo *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_modinv64_modinfo *psStack_1a8;
  int iStack_1a0;
  uint uStack_19c;
  secp256k1_modinv32_trans2x2 sStack_198;
  secp256k1_modinv64_modinfo sStack_188;
  secp256k1_modinv64_modinfo sStack_158;
  secp256k1_modinv64_modinfo *psStack_128;
  secp256k1_modinv64_modinfo *psStack_120;
  secp256k1_modinv64_modinfo *psStack_118;
  secp256k1_modinv64_modinfo *psStack_110;
  uint16_t *puStack_108;
  uint16_t *puStack_100;
  code *pcStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv64_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  secp256k1_modinv64_modinfo *psVar30;
  
  psVar31 = &local_e8;
  psVar43 = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4] = 0;
  uVar36 = 0;
  uVar34 = 0x8421084210842109;
  do {
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar36 >> 1;
    piVar1 = local_e8.modulus.v + ((byte)((uVar36 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((in[uVar36 >> 4 & 0xfffffff] >> ((uint)uVar36 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar71 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar36 & 0x3fU);
    uVar36 = uVar36 + 1;
  } while ((int)uVar36 != 0x100);
  local_88.modulus.v[4] =
       (int64_t)(local_e8.modulus.v[1] | local_e8.modulus.v[0] | local_e8.modulus.v[2] |
                 local_e8.modulus.v[3] | local_e8.modulus.v[4]);
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  psVar64 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)psVar64 >> 1;
    piVar1 = local_b8.modulus.v + ((byte)(((ulong)psVar64 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((mod[(ulong)psVar64 >> 4 & 0xfffffff] >> ((uint)psVar64 & 0xf) & 1)
                               != 0) <<
                        ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar64 & 0x3fU);
    iVar12 = local_b8.modulus.v[0];
    psVar64 = (secp256k1_modinv64_modinfo *)((long)(psVar64->modulus).v + 1);
  } while ((int)psVar64 != 0x100);
  pcVar58 = (code *)0x3fffffffffffffff;
  pcStack_f0 = (code *)0x14a46f;
  psVar42 = (secp256k1_modinv64_modinfo *)local_b8.modulus.v[0];
  uVar18 = modinv2p64(local_b8.modulus.v[0]);
  iVar13 = local_88.modulus.v[4];
  local_b8.modulus_inv62 = uVar18 & 0x3fffffffffffffff;
  psVar55 = (secp256k1_modinv64_modinfo *)(iVar12 * uVar18 & 0x3fffffffffffffff);
  if (psVar55 != (secp256k1_modinv64_modinfo *)0x1) goto LAB_0014a88d;
  psVar55 = (secp256k1_modinv64_modinfo *)0x3fffffffffffffff;
  if ((secp256k1_modinv64_modinfo *)local_88.modulus.v[4] == (secp256k1_modinv64_modinfo *)0x0) {
LAB_0014a5f0:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4] = 0;
    uVar36 = 0;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar36 >> 1;
      piVar1 = local_e8.modulus.v + ((byte)((uVar36 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
      *piVar1 = *piVar1 | (ulong)((in[uVar36 >> 4 & 0xfffffff] >> ((uint)uVar36 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar36 & 0x3fU);
      uVar36 = uVar36 + 1;
    } while ((int)uVar36 != 0x100);
    local_88.modulus_inv62 = (uint64_t)mod;
    iVar15 = 8;
    do {
      uVar36 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3e;
      lVar19 = local_b8.modulus.v[uVar36];
      if (lVar19 < 1) {
        if ((lVar19 < 0) && (lVar29 = local_b8.modulus.v[uVar36 + 1], -0x4000000000000000 < lVar29))
        {
          local_b8.modulus.v[uVar36] = lVar19 + 0x4000000000000000;
          lVar29 = lVar29 + -1;
          goto LAB_0014a6c0;
        }
      }
      else {
        lVar29 = local_b8.modulus.v[uVar36 + 1];
        if (lVar29 < 0x4000000000000000) {
          local_b8.modulus.v[uVar36] = lVar19 + -0x4000000000000000;
          lVar29 = lVar29 + 1;
LAB_0014a6c0:
          local_b8.modulus.v[uVar36 + 1] = lVar29;
        }
      }
      uVar51 = secp256k1_test_state[1] << 0x11;
      uVar37 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar36 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar37;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar36;
      secp256k1_test_state[2] = uVar37 ^ uVar51;
      secp256k1_test_state[3] = uVar36 << 0x2d | uVar36 >> 0x13;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    mod = (uint16_t *)
          (ulong)((secp256k1_modinv64_modinfo *)iVar13 != (secp256k1_modinv64_modinfo *)0x0);
    psVar55 = (secp256k1_modinv64_modinfo *)0x3fffffffffffff01;
    while( true ) {
      cVar53 = (char)psVar55;
      pcVar58 = secp256k1_modinv64_var;
      if (cVar53 != '\0') {
        pcVar58 = secp256k1_modinv64;
      }
      pcStack_f0 = (code *)0x14a74a;
      (*pcVar58)(&local_e8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar36 = 0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar36 >> 1;
        out[uVar36 >> 4 & 0xfffffff] =
             out[uVar36 >> 4 & 0xfffffff] |
             (ushort)(((ulong)local_e8.modulus.v[((byte)((uVar36 & 0xffffffff) >> 1) & 0x7f) / 0x1f]
                       >> ((ulong)((SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                  (int)uVar36) & 0x3f) & 1) != 0) << ((byte)uVar36 & 0xf);
        uVar36 = uVar36 + 1;
      } while ((int)uVar36 != 0x100);
      psVar42 = &local_88;
      pcStack_f0 = (code *)0x14a7bb;
      psVar64 = (secp256k1_modinv64_modinfo *)out;
      mulmod256((uint16_t *)psVar42,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] !=
          ((secp256k1_modinv64_modinfo *)iVar13 != (secp256k1_modinv64_modinfo *)0x0)) break;
      lVar19 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar19 * 2) != 0) {
          pcStack_f0 = (code *)0x14a883;
          test_modinv64_uint16_cold_4();
          goto LAB_0014a883;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pcStack_f0 = (code *)0x14a7eb;
      (*pcVar58)(&local_e8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      psVar64 = (secp256k1_modinv64_modinfo *)0x0;
      do {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (ulong)psVar64 >> 1;
        psVar42 = (secp256k1_modinv64_modinfo *)
                  ((ulong)(((ulong)local_e8.modulus.v
                                   [((byte)(((ulong)psVar64 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                            ((ulong)((SUB164(auVar11 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                    (int)psVar64) & 0x3f) & 1) != 0) << ((byte)psVar64 & 0xf));
        puVar2 = (ushort *)((long)local_88.modulus.v + ((ulong)psVar64 >> 4 & 0xfffffff) * 2);
        *puVar2 = *puVar2 | (ushort)psVar42;
        psVar64 = (secp256k1_modinv64_modinfo *)((long)(psVar64->modulus).v + 1);
      } while ((int)psVar64 != 0x100);
      lVar19 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar19 * 2) != in[lVar19]) goto LAB_0014a883;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      psVar55 = (secp256k1_modinv64_modinfo *)0x0;
      if (cVar53 == '\0') {
        return;
      }
    }
    goto LAB_0014a888;
  }
  pcStack_f0 = (code *)0x14a4b2;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4] = 0;
  uVar36 = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar36 >> 1;
    piVar1 = local_e8.modulus.v + ((byte)((uVar36 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)local_88.modulus.v + (uVar36 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar36 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar36 & 0x3fU);
    uVar36 = uVar36 + 1;
  } while ((int)uVar36 != 0x100);
  psVar64 = &local_b8;
  pcStack_f0 = (code *)0x14a528;
  uVar14 = secp256k1_jacobi64_maybe_var(&local_e8.modulus,psVar64);
  pcVar58 = (code *)iVar13;
  if (1 < uVar14) goto LAB_0014a892;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x14a561;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4] = 0;
  uVar36 = 0;
  do {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar36 >> 1;
    piVar1 = local_e8.modulus.v + ((byte)((uVar36 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)local_88.modulus.v + (uVar36 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar36 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar36 & 0x3fU);
    uVar36 = uVar36 + 1;
  } while ((int)uVar36 != 0x100);
  psVar64 = &local_b8;
  pcStack_f0 = (code *)0x14a5d7;
  iVar15 = secp256k1_jacobi64_maybe_var(&local_e8.modulus,psVar64);
  if ((iVar15 == 0) || (iVar15 == 1 - (*mod & 2))) goto LAB_0014a5f0;
LAB_0014a897:
  pcStack_f0 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar43 & 1) != 0) {
    iVar15 = 6;
    do {
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    return;
  }
  pcStack_f8 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_f8 = (code *)0x8421084210842109;
  puStack_100 = out;
  puStack_108 = in;
  psStack_110 = (secp256k1_modinv64_modinfo *)pcVar58;
  psStack_118 = psVar55;
  psStack_120 = (secp256k1_modinv64_modinfo *)mod;
  sStack_158.modulus.v[4]._0_4_ = (int)(psVar64->modulus).v[4];
  sStack_158.modulus.v[0] = (psVar64->modulus).v[0];
  sStack_158.modulus.v[2] = (psVar64->modulus).v[2];
  sStack_158.modulus.v[3] = (psVar64->modulus).v[3];
  sStack_158.modulus.v[1] = (psVar64->modulus).v[1];
  iVar12 = (psVar43->modulus).v[0];
  sStack_188.modulus.v[1] = (psVar43->modulus).v[1];
  piVar1 = (psVar43->modulus).v + 2;
  sStack_188.modulus.v[2] = *piVar1;
  sStack_188.modulus.v[3] = (psVar43->modulus).v[3];
  sStack_188.modulus.v[0]._0_4_ = (uint)iVar12;
  sStack_188.modulus.v[0]._4_4_ = (uint)((ulong)iVar12 >> 0x20);
  sStack_188.modulus.v[4]._0_4_ = (int)(psVar43->modulus).v[4];
  auVar71 = packssdw(*(undefined1 (*) [16])(psVar43->modulus).v,*(undefined1 (*) [16])piVar1);
  if (((((((((auVar71 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar71 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar71 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar71 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar71[0xf]) &&
     (-1 < (int)sStack_188.modulus.v[4])) {
    uVar14 = (uint)((ulong)sStack_188.modulus.v[1] >> 0x20) | (uint)sStack_188.modulus.v[1] |
             sStack_188.modulus.v[0]._4_4_ | (uint)sStack_188.modulus.v[0];
    psVar50 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
    psVar31 = psVar55;
    psVar42 = psVar64;
    if (((int)((ulong)sStack_188.modulus.v[3] >> 0x20) != 0 ||
        (((int)sStack_188.modulus.v[3] != 0 ||
         ((int)((ulong)sStack_188.modulus.v[2] >> 0x20) != 0 || (int)sStack_188.modulus.v[2] != 0))
        || uVar14 != 0)) || (int)sStack_188.modulus.v[4] != 0) {
      psStack_1a8 = (secp256k1_modinv64_modinfo *)0x9;
      uVar34 = 0xffffffff;
      iStack_1a0 = 0;
      mod = (uint16_t *)(sStack_158.modulus.v[0] & 0xffffffff);
      out = (uint16_t *)0x0;
      psStack_128 = psVar64;
      do {
        psVar42 = psStack_128;
        psVar31 = psStack_1a8;
        uStack_19c = sStack_188.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_188.modulus.v[0];
        uVar54 = sStack_158.modulus.v[0]._4_4_ << 0x1e | (uint)mod;
        psVar55 = (secp256k1_modinv64_modinfo *)(ulong)uVar54;
        uVar14 = 1;
        psVar50 = (secp256k1_modinv64_modinfo *)0x0;
        uVar16 = 0x1e;
        psVar43 = (secp256k1_modinv64_modinfo *)0x0;
        uVar47 = 1;
        mod = (uint16_t *)psVar55;
        uVar49 = uStack_19c;
        while( true ) {
          in = out;
          psVar64 = (secp256k1_modinv64_modinfo *)(ulong)uStack_19c;
          pcVar58 = (code *)&sStack_188;
          uVar57 = (uint)mod;
          uVar27 = -1 << ((byte)uVar16 & 0x1f) | uVar49;
          uVar21 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
            }
          }
          bVar20 = (byte)uVar21;
          uVar49 = uVar49 >> (bVar20 & 0x1f);
          uVar47 = uVar47 << (bVar20 & 0x1f);
          uVar41 = (int)psVar43 << (bVar20 & 0x1f);
          psVar43 = (secp256k1_modinv64_modinfo *)(ulong)uVar41;
          uVar27 = (int)uVar34 - uVar21;
          uVar34 = (ulong)uVar27;
          psVar30 = (secp256k1_modinv64_modinfo *)((ulong)mod >> 1);
          uVar62 = ((uint)((ulong)mod >> 2) ^ (uint)psVar30) & uVar21 ^ (uint)in;
          out = (uint16_t *)(ulong)uVar62;
          uVar16 = uVar16 - uVar21;
          uVar21 = (uint)psVar50;
          if (uVar16 == 0) break;
          if (((ulong)mod & 1) == 0) {
            pcStack_1b0 = (code *)0x14ace2;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0014ace2:
            pcStack_1b0 = (code *)0x14ace7;
            secp256k1_jacobi32_maybe_var_cold_5();
LAB_0014ace7:
            pcStack_1b0 = (code *)0x14acec;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_0014acec:
            mod = (uint16_t *)psVar30;
            pcStack_1b0 = (code *)0x14acf1;
            secp256k1_jacobi32_maybe_var_cold_2();
            psVar50 = psVar55;
LAB_0014acf1:
            psVar55 = psVar50;
            pcStack_1b0 = (code *)0x14acf6;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_0014acf6;
          }
          if ((uVar49 & 1) == 0) goto LAB_0014ace2;
          uVar28 = uVar41 * uStack_19c + uVar47 * uVar54;
          psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar28;
          bVar20 = 0x1e - (char)uVar16;
          uVar60 = uVar57 << (bVar20 & 0x1f);
          in = (uint16_t *)(ulong)uVar60;
          if (uVar28 != uVar60) goto LAB_0014ace7;
          uVar60 = uVar14 * uStack_19c + uVar21 * uVar54;
          in = (uint16_t *)(ulong)uVar60;
          uVar28 = uVar49 << (bVar20 & 0x1f);
          psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar28;
          if (uVar60 != uVar28) goto LAB_0014acec;
          in = (uint16_t *)psVar50;
          if ((int)uVar27 < 0) {
            uVar34 = (ulong)-uVar27;
            out = (uint16_t *)(ulong)(uVar62 ^ (uVar49 & uVar57) >> 1);
            mod = (uint16_t *)(ulong)uVar49;
            psVar43 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
            in = (uint16_t *)(ulong)uVar47;
            uVar47 = uVar21;
            uVar49 = uVar57;
            uVar14 = uVar41;
          }
          uVar21 = (int)uVar34 + 1;
          if ((int)uVar16 <= (int)uVar21) {
            uVar21 = uVar16;
          }
          psVar64 = psVar55;
          psVar50 = (secp256k1_modinv64_modinfo *)(ulong)uVar14;
          if (0x1e < uVar21) goto LAB_0014acf1;
          uVar57 = (uint)(0xff << (-(char)uVar21 & 0x1fU)) >> (-(char)uVar21 & 0x1fU);
          uVar21 = secp256k1_modinv32_inv256[(uint)((ulong)mod >> 1) & 0x7f] * uVar49 & uVar57;
          uVar49 = uVar21 * (int)mod + uVar49;
          psVar50 = (secp256k1_modinv64_modinfo *)(ulong)(uVar21 * uVar47 + (int)in);
          uVar14 = uVar21 * (int)psVar43 + uVar14;
          psVar64 = (secp256k1_modinv64_modinfo *)(ulong)uStack_19c;
          if ((uVar49 & uVar57) != 0) {
LAB_0014acf6:
            pcVar58 = (code *)&sStack_188;
            pcStack_1b0 = (code *)0x14acfb;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_0014acfb;
          }
        }
        lVar19 = (long)(int)uVar14 * (long)(int)uVar47 - (long)(int)uVar21 * (long)(int)uVar41;
        mod = (uint16_t *)&sStack_158;
        sStack_198.u = uVar47;
        sStack_198.v = uVar41;
        sStack_198.q = uVar21;
        sStack_198.r = uVar14;
        if ((lVar19 != -0x40000000) && (lVar19 != 0x40000000)) goto LAB_0014ad2d;
        iVar22 = (int)psStack_1a8;
        psVar64 = (secp256k1_modinv64_modinfo *)((ulong)psStack_1a8 & 0xffffffff);
        pcStack_1b0 = (code *)0x14ab7f;
        psVar43 = (secp256k1_modinv64_modinfo *)mod;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)mod,iVar22,
                            (secp256k1_modinv32_signed30 *)psStack_128,0);
        if (iVar15 < 1) goto LAB_0014ad00;
        psVar64 = (secp256k1_modinv64_modinfo *)((ulong)psVar31 & 0xffffffff);
        pcStack_1b0 = (code *)0x14ab9a;
        psVar43 = (secp256k1_modinv64_modinfo *)mod;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)mod,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar42,1);
        if (0 < iVar15) goto LAB_0014ad05;
        psVar64 = (secp256k1_modinv64_modinfo *)((ulong)psVar31 & 0xffffffff);
        pcStack_1b0 = (code *)0x14abb2;
        psVar43 = (secp256k1_modinv64_modinfo *)pcVar58;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar58,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar42,0);
        if (iVar15 < 1) goto LAB_0014ad0a;
        psVar64 = (secp256k1_modinv64_modinfo *)((ulong)psVar31 & 0xffffffff);
        pcStack_1b0 = (code *)0x14abcd;
        psVar43 = (secp256k1_modinv64_modinfo *)pcVar58;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar58,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar42,1);
        if (-1 < iVar15) goto LAB_0014ad0f;
        pcStack_1b0 = (code *)0x14abe8;
        secp256k1_modinv32_update_fg_30_var
                  (iVar22,(secp256k1_modinv32_signed30 *)mod,(secp256k1_modinv32_signed30 *)pcVar58,
                   &sStack_198);
        mod = (uint16_t *)(sStack_158.modulus.v[0] & 0xffffffff);
        if ((int)sStack_158.modulus.v[0] == 1) {
          if (iVar22 < 2) {
            return;
          }
          uVar14 = 0;
          uVar36 = 1;
          do {
            uVar14 = uVar14 | *(uint *)((long)sStack_158.modulus.v + uVar36 * 4);
            uVar36 = uVar36 + 1;
          } while (((ulong)psVar31 & 0xffffffff) != uVar36);
          psVar31 = psStack_1a8;
          if (uVar14 == 0) {
            return;
          }
        }
        iVar15 = (int)psVar31;
        psVar31 = (secp256k1_modinv64_modinfo *)((ulong)psVar31 & 0xffffffff);
        if ((-1 < iVar15 + -2 && *(int *)((long)sStack_158.modulus.v + (long)iVar15 * 4 + -4) == 0)
            && *(int *)((long)sStack_188.modulus.v + (long)iVar15 * 4 + -4) == 0) {
          psVar31 = (secp256k1_modinv64_modinfo *)(ulong)(iVar15 - 1);
        }
        pcVar58 = (code *)&sStack_158;
        pcStack_1b0 = (code *)0x14ac4e;
        iVar22 = (int)psVar31;
        psVar64 = psVar31;
        psVar43 = (secp256k1_modinv64_modinfo *)pcVar58;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar58,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar42,0);
        if (iVar15 < 1) goto LAB_0014ad14;
        pcStack_1b0 = (code *)0x14ac69;
        psVar64 = psVar31;
        psVar43 = (secp256k1_modinv64_modinfo *)pcVar58;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar58,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar42,1);
        if (0 < iVar15) goto LAB_0014ad19;
        pcVar58 = (code *)&sStack_188;
        pcStack_1b0 = (code *)0x14ac86;
        psVar64 = psVar31;
        psVar43 = (secp256k1_modinv64_modinfo *)pcVar58;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar58,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar42,0);
        if (iVar15 < 1) goto LAB_0014ad1e;
        pcStack_1b0 = (code *)0x14aca5;
        psVar64 = psVar31;
        psVar43 = (secp256k1_modinv64_modinfo *)pcVar58;
        psStack_1a8 = psVar31;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar58,iVar22,
                            (secp256k1_modinv32_signed30 *)psVar42,1);
        if (-1 < iVar15) goto LAB_0014ad23;
        iStack_1a0 = iStack_1a0 + 1;
        if (iStack_1a0 == 0x19) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_0014acfb:
    pcStack_1b0 = (code *)0x14ad00;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar31 = psVar55;
    psVar42 = (secp256k1_modinv64_modinfo *)in;
LAB_0014ad00:
    pcStack_1b0 = (code *)0x14ad05;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_0014ad05:
    pcStack_1b0 = (code *)0x14ad0a;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_0014ad0a:
    pcStack_1b0 = (code *)0x14ad0f;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_0014ad0f:
    pcStack_1b0 = (code *)0x14ad14;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_0014ad14:
    pcStack_1b0 = (code *)0x14ad19;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_0014ad19:
    pcStack_1b0 = (code *)0x14ad1e;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_0014ad1e:
    pcStack_1b0 = (code *)0x14ad23;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_0014ad23:
    pcStack_1b0 = (code *)0x14ad28;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar50 = psVar64;
  }
  psVar64 = psVar50;
  pcStack_1b0 = (code *)0x14ad2d;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_0014ad2d:
  pcStack_1b0 = secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  pcStack_1b0 = (code *)uVar34;
  psStack_1b8 = (secp256k1_modinv64_modinfo *)out;
  psStack_1c0 = psVar42;
  psStack_1c8 = (secp256k1_modinv64_modinfo *)pcVar58;
  psStack_1d0 = psVar31;
  psStack_1d8 = (secp256k1_modinv64_modinfo *)mod;
  auStack_220._16_8_ = 0;
  auStack_220._24_8_ = 0;
  auStack_220._0_8_ = 0;
  auStack_220._8_8_ = 0;
  auStack_220._32_4_ = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  auStack_220._36_4_ = 1;
  sStack_290.modulus.v[4]._0_4_ = (int)(psVar64->modulus).v[4];
  uStack_258 = psVar64;
  sStack_290.modulus.v[2] = (psVar64->modulus).v[2];
  sStack_290.modulus.v[3] = (psVar64->modulus).v[3];
  sStack_290.modulus.v[0] = (psVar64->modulus).v[0];
  sStack_290.modulus.v[1] = (psVar64->modulus).v[1];
  sStack_250.modulus.v[4]._0_4_ = (int)(psVar43->modulus).v[4];
  sStack_250.modulus.v[0] = (psVar43->modulus).v[0];
  sStack_250.modulus.v[1] = (psVar43->modulus).v[1];
  psStack_260 = psVar43;
  sStack_250.modulus.v[2] = (psVar43->modulus).v[2];
  sStack_250.modulus.v[3] = (psVar43->modulus).v[3];
  iStack_2ac = 0;
  uVar34 = 0xffffffff;
  psStack_2a8 = (secp256k1_modinv64_modinfo *)0x9;
LAB_0014adc7:
  psVar31 = uStack_258;
  psVar64 = psStack_2a8;
  psVar55 = (secp256k1_modinv64_modinfo *)(sStack_290.modulus.v[0] & 0xffffffff);
  psVar43 = (secp256k1_modinv64_modinfo *)(sStack_250.modulus.v[0] & 0xffffffff);
  uVar14 = 1;
  psVar50 = (secp256k1_modinv64_modinfo *)0x0;
  iVar15 = 0x1e;
  uVar16 = 0;
  psVar42 = (secp256k1_modinv64_modinfo *)0x1;
  uVar47 = (uint)sStack_290.modulus.v[0];
  uVar49 = (uint)sStack_250.modulus.v[0];
  while( true ) {
    uVar54 = -1 << ((byte)iVar15 & 0x1f) | uVar49;
    iVar22 = 0;
    if (uVar54 != 0) {
      for (; (uVar54 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
      }
    }
    bVar20 = (byte)iVar22;
    uVar49 = uVar49 >> (bVar20 & 0x1f);
    uVar21 = (int)psVar42 << (bVar20 & 0x1f);
    psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar21;
    uVar16 = uVar16 << (bVar20 & 0x1f);
    uVar57 = (int)uVar34 - iVar22;
    uVar34 = (ulong)uVar57;
    iVar15 = iVar15 - iVar22;
    iVar22 = (int)psVar50;
    if (iVar15 == 0) break;
    if ((uVar47 & 1) == 0) {
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b1ee;
      secp256k1_modinv32_var_cold_7();
LAB_0014b1ee:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b1f3;
      secp256k1_modinv32_var_cold_6();
LAB_0014b1f3:
      psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar54;
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b1f8;
      secp256k1_modinv32_var_cold_1();
LAB_0014b1f8:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b1fd;
      secp256k1_modinv32_var_cold_2();
LAB_0014b1fd:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b202;
      secp256k1_modinv32_var_cold_5();
LAB_0014b202:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b207;
      secp256k1_modinv32_var_cold_4();
      goto LAB_0014b207;
    }
    if ((uVar49 & 1) == 0) goto LAB_0014b1ee;
    uVar54 = uVar16 * (uint)sStack_250.modulus.v[0] + uVar21 * (uint)sStack_290.modulus.v[0];
    bVar20 = 0x1e - (char)iVar15;
    uVar27 = uVar47 << (bVar20 & 0x1f);
    pcVar58 = (code *)(ulong)uVar27;
    if (uVar54 != uVar27) goto LAB_0014b1f3;
    uVar54 = uVar14 * (uint)sStack_250.modulus.v[0] + iVar22 * (uint)sStack_290.modulus.v[0];
    pcVar58 = (code *)(ulong)uVar54;
    uVar27 = uVar49 << (bVar20 & 0x1f);
    psVar30 = (secp256k1_modinv64_modinfo *)(ulong)uVar27;
    if (uVar54 != uVar27) goto LAB_0014b1f8;
    if (uVar57 - 0x2f0 < 0xfffffa21) goto LAB_0014b1fd;
    psVar30 = psVar50;
    if ((int)uVar57 < 0) {
      uVar34 = (ulong)-uVar57;
      uVar54 = -uVar47;
      uVar57 = -uVar16;
      psVar42 = psVar50;
      psVar30 = (secp256k1_modinv64_modinfo *)(ulong)-uVar21;
      uVar47 = uVar49;
      uVar49 = uVar54;
      uVar16 = uVar14;
      uVar14 = uVar57;
    }
    pcVar58 = (code *)(ulong)uVar14;
    iVar22 = (int)uVar34 + 1;
    if (iVar15 <= iVar22) {
      iVar22 = iVar15;
    }
    if (iVar22 - 0x1fU < 0xffffffe2) goto LAB_0014b202;
    uVar21 = (uint)(0xff << (-(char)iVar22 & 0x1fU)) >> (-(char)iVar22 & 0x1fU);
    out = (uint16_t *)(ulong)uVar21;
    uVar54 = secp256k1_modinv32_inv256[uVar47 >> 1 & 0x7f] * uVar49 & uVar21;
    uVar49 = uVar49 + uVar54 * uVar47;
    psVar50 = (secp256k1_modinv64_modinfo *)(ulong)(uVar54 * (int)psVar42 + (int)psVar30);
    uVar14 = uVar54 * uVar16 + uVar14;
    if ((uVar49 & uVar21) != 0) {
LAB_0014b207:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b20c;
      secp256k1_modinv32_var_cold_3();
      psVar64 = psVar30;
      goto LAB_0014b20c;
    }
  }
  sStack_2a0.u = uVar21;
  sStack_2a0.v = uVar16;
  sStack_2a0.q = iVar22;
  sStack_2a0.r = uVar14;
  if ((long)(int)uVar14 * (long)(int)uVar21 - (long)iVar22 * (long)(int)uVar16 == 0x40000000) {
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14af6d;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_220,
               (secp256k1_modinv32_signed30 *)(auStack_220 + 0x24),&sStack_2a0,
               (secp256k1_modinv32_modinfo *)uStack_258);
    out = (uint16_t *)&sStack_290;
    iVar22 = (int)psVar64;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14af85;
    psVar55 = psVar64;
    psVar43 = (secp256k1_modinv64_modinfo *)out;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)out,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar31,-1);
    if (iVar15 < 1) goto LAB_0014b211;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14afa0;
    psVar55 = psVar64;
    psVar43 = (secp256k1_modinv64_modinfo *)out;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)out,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar31,1);
    if (0 < iVar15) goto LAB_0014b216;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14afbb;
    psVar55 = psVar64;
    psVar43 = &sStack_250;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_250,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar31,-1);
    if (iVar15 < 1) goto LAB_0014b21b;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14afd6;
    psVar55 = psVar64;
    psVar43 = &sStack_250;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_250,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar31,1);
    if (-1 < iVar15) goto LAB_0014b220;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14aff3;
    secp256k1_modinv32_update_fg_30_var
              (iVar22,(secp256k1_modinv32_signed30 *)&sStack_290,
               (secp256k1_modinv32_signed30 *)&sStack_250,&sStack_2a0);
    if ((uint)sStack_250.modulus.v[0] == 0) {
      if (1 < iVar22) {
        uVar14 = 0;
        psVar43 = (secp256k1_modinv64_modinfo *)0x1;
        do {
          uVar14 = uVar14 | *(uint *)((long)sStack_250.modulus.v + (long)psVar43 * 4);
          psVar43 = (secp256k1_modinv64_modinfo *)((long)(psVar43->modulus).v + 1);
        } while (psVar64 != psVar43);
        if (uVar14 != 0) goto LAB_0014b022;
      }
      psVar43 = &sStack_250;
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b0fe;
      psVar55 = psVar64;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar43,iVar22,&SECP256K1_SIGNED30_ONE,0);
      psVar42 = psVar64;
      if (iVar15 != 0) goto LAB_0014b23e;
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b11f;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)&sStack_290,iVar22,&SECP256K1_SIGNED30_ONE,
                          -1);
      psVar42 = psStack_260;
      if (iVar15 != 0) {
        psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b144;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)&sStack_290,iVar22,
                            &SECP256K1_SIGNED30_ONE,1);
        if (iVar15 != 0) {
          psVar55 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b15e;
          psVar43 = psVar42;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar42,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar15 != 0) goto LAB_0014b243;
          psVar43 = (secp256k1_modinv64_modinfo *)auStack_220;
          psVar55 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b181;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar43,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar15 != 0) goto LAB_0014b243;
          psVar43 = &sStack_290;
          psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b19e;
          psVar55 = psVar64;
          iVar15 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar43,iVar22,
                              (secp256k1_modinv32_signed30 *)psVar31,1);
          if (iVar15 != 0) goto LAB_0014b243;
        }
      }
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b1c0;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_220,
                 *(int32_t *)((long)sStack_290.modulus.v + (long)iVar22 * 4 + -4),
                 (secp256k1_modinv32_modinfo *)psVar31);
      *(undefined4 *)((psVar42->modulus).v + 4) = auStack_220._32_4_;
      (psVar42->modulus).v[2] = auStack_220._16_8_;
      (psVar42->modulus).v[3] = auStack_220._24_8_;
      (psVar42->modulus).v[0] = auStack_220._0_8_;
      (psVar42->modulus).v[1] = auStack_220._8_8_;
      return;
    }
LAB_0014b022:
    uVar14 = *(uint *)((long)sStack_290.modulus.v + (long)iVar22 * 4 + -4);
    uVar47 = *(uint *)((long)&uStack_258 + (long)iVar22 * 4 + 4);
    iVar15 = iVar22 + -2;
    uVar49 = (int)uVar14 >> 0x1f ^ uVar14 | iVar15 >> 0x1f;
    psVar43 = (secp256k1_modinv64_modinfo *)(ulong)uVar49;
    uVar49 = (int)uVar47 >> 0x1f ^ uVar47 | uVar49;
    psVar55 = (secp256k1_modinv64_modinfo *)(ulong)uVar49;
    if (uVar49 == 0) {
      psVar64 = (secp256k1_modinv64_modinfo *)(ulong)(iVar22 - 1);
      puVar3 = (uint *)((long)sStack_290.modulus.v + (long)iVar15 * 4);
      *puVar3 = *puVar3 | uVar14 << 0x1e;
      puVar3 = (uint *)((long)sStack_250.modulus.v + (long)iVar15 * 4);
      *puVar3 = *puVar3 | uVar47 << 0x1e;
    }
    out = (uint16_t *)&sStack_290;
    if (iStack_2ac == 0x18) goto LAB_0014b225;
    iVar22 = (int)psVar64;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b081;
    psVar55 = psVar64;
    psVar43 = (secp256k1_modinv64_modinfo *)out;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)out,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar31,-1);
    if (iVar15 < 1) goto LAB_0014b22a;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b09c;
    psVar55 = psVar64;
    psVar43 = (secp256k1_modinv64_modinfo *)out;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)out,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar31,1);
    if (0 < iVar15) goto LAB_0014b22f;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b0b7;
    psVar55 = psVar64;
    psVar43 = &sStack_250;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_250,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar31,-1);
    if (iVar15 < 1) goto LAB_0014b234;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b0d2;
    psVar55 = psVar64;
    psVar43 = &sStack_250;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_250,iVar22,
                        (secp256k1_modinv32_signed30 *)psVar31,1);
    if (-1 < iVar15) goto LAB_0014b239;
    iStack_2ac = iStack_2ac + 1;
    psStack_2a8 = psVar64;
    goto LAB_0014adc7;
  }
LAB_0014b20c:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b211;
  secp256k1_modinv32_var_cold_8();
  psVar31 = psVar42;
LAB_0014b211:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b216;
  secp256k1_modinv32_var_cold_19();
LAB_0014b216:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b21b;
  secp256k1_modinv32_var_cold_18();
LAB_0014b21b:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b220;
  secp256k1_modinv32_var_cold_17();
LAB_0014b220:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b225;
  secp256k1_modinv32_var_cold_16();
LAB_0014b225:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b22a;
  secp256k1_modinv32_var_cold_13();
LAB_0014b22a:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b22f;
  secp256k1_modinv32_var_cold_12();
LAB_0014b22f:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b234;
  secp256k1_modinv32_var_cold_11();
LAB_0014b234:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b239;
  secp256k1_modinv32_var_cold_10();
LAB_0014b239:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b23e;
  secp256k1_modinv32_var_cold_9();
  psVar42 = psVar64;
LAB_0014b23e:
  psVar64 = (secp256k1_modinv64_modinfo *)out;
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x14b243;
  secp256k1_modinv32_var_cold_14();
LAB_0014b243:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  psStack_2b8 = &sStack_250;
  psStack_2c0 = psVar64;
  psStack_2c8 = psVar42;
  psStack_2d0 = (secp256k1_modinv64_modinfo *)pcVar58;
  uStack_2d8 = uVar34;
  psStack_2e0 = psVar31;
  auStack_328._16_8_ = 0;
  auStack_328._24_8_ = 0;
  auStack_328._0_8_ = 0;
  auStack_328._8_8_ = 0;
  auStack_328._32_4_ = 0;
  uStack_2f0 = 0;
  uStack_2e8 = 0;
  uStack_300 = 0;
  uStack_2f8 = 0;
  auStack_328._36_4_ = 1;
  sStack_398.modulus.v[4]._0_4_ = (int32_t)(psVar55->modulus).v[4];
  sStack_398.modulus.v[2] = (psVar55->modulus).v[2];
  sStack_398.modulus.v[3] = (psVar55->modulus).v[3];
  sStack_398.modulus.v[0] = (psVar55->modulus).v[0];
  sStack_398.modulus.v[1] = (psVar55->modulus).v[1];
  sStack_358.modulus.v[4]._0_4_ = (int)(psVar43->modulus).v[4];
  sStack_358.modulus.v[0] = (psVar43->modulus).v[0];
  sStack_358.modulus.v[1] = (psVar43->modulus).v[1];
  sStack_398.modulus_inv62 = (uint64_t)psVar43;
  sStack_358.modulus.v[2] = (psVar43->modulus).v[2];
  sStack_358.modulus.v[3] = (psVar43->modulus).v[3];
  iVar15 = 0;
  uVar34 = 0xffffffff;
  psStack_3c0 = psVar55;
  do {
    uStack_360 = (ulong)(int)(uint)sStack_398.modulus.v[0];
    uVar37 = (ulong)(int)(uint)sStack_358.modulus.v[0];
    uVar36 = 0;
    psVar43 = (secp256k1_modinv64_modinfo *)0x1;
    uVar14 = 0;
    uVar16 = 0;
    uVar54 = 1;
    uVar47 = (uint)sStack_358.modulus.v[0];
    uVar49 = (uint)sStack_398.modulus.v[0];
    do {
      uVar21 = (uint)sStack_398.modulus.v[0];
      iStack_3b4 = iVar15;
      if ((uVar49 & 1) == 0) {
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b706;
        secp256k1_modinv32_cold_17();
LAB_0014b706:
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b70b;
        secp256k1_modinv32_cold_1();
LAB_0014b70b:
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b710;
        secp256k1_modinv32_cold_2();
        psVar55 = (secp256k1_modinv64_modinfo *)pcVar58;
LAB_0014b710:
        uVar54 = uVar21;
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b715;
        secp256k1_modinv32_cold_16();
        goto LAB_0014b715;
      }
      uVar27 = (uint)psVar43;
      uVar41 = uVar14 * (uint)sStack_358.modulus.v[0] + uVar27 * (uint)sStack_398.modulus.v[0];
      psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar41;
      uVar57 = uVar49 << ((byte)uVar36 & 0x1f);
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar57;
      if (uVar41 != uVar57) goto LAB_0014b706;
      uVar41 = uVar54 * (uint)sStack_358.modulus.v[0] + uVar16 * (uint)sStack_398.modulus.v[0];
      psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uVar41;
      uVar57 = uVar47 << ((byte)uVar36 & 0x1f);
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar57;
      if (uVar41 != uVar57) goto LAB_0014b70b;
      uStack_3ac = (int)(uint)uVar34 >> 0x1f;
      psVar42 = (secp256k1_modinv64_modinfo *)(ulong)uStack_3ac;
      uStack_3b0 = uVar47 & 1;
      uVar57 = -uStack_3b0;
      psVar64 = (secp256k1_modinv64_modinfo *)(ulong)uVar57;
      uVar41 = uStack_3ac & uVar57;
      psVar31 = (secp256k1_modinv64_modinfo *)(ulong)uVar41;
      uVar62 = (uint)uVar34 ^ uVar41;
      uVar34 = (ulong)uVar62;
      psVar55 = (secp256k1_modinv64_modinfo *)(ulong)(uVar62 - 0x25b);
      if (uVar62 - 0x25b < 0xfffffb4d) goto LAB_0014b710;
      uVar34 = (ulong)(uVar62 - 1);
      uVar54 = uVar54 + ((uStack_3ac ^ uVar14) - uStack_3ac & uVar57);
      uVar14 = (uVar14 + (uVar54 & uVar41)) * 2;
      uVar16 = uVar16 + ((uStack_3ac ^ uVar27) - uStack_3ac & uVar57);
      uVar21 = (uVar27 + (uVar16 & uVar41)) * 2;
      psVar43 = (secp256k1_modinv64_modinfo *)(ulong)uVar21;
      uVar57 = ((uStack_3ac ^ uVar49) - uStack_3ac & uVar57) + uVar47;
      uVar47 = uVar57 >> 1;
      uVar57 = uVar57 & uVar41;
      pcVar58 = (code *)(ulong)uVar57;
      uVar49 = uVar49 + uVar57;
      uVar57 = (int)uVar36 + 1;
      uVar36 = (ulong)uVar57;
    } while (uVar57 != 0x1e);
    psVar42 = (secp256k1_modinv64_modinfo *)(long)(int)uVar21;
    psVar55 = (secp256k1_modinv64_modinfo *)(long)(int)uVar14;
    psVar64 = (secp256k1_modinv64_modinfo *)(long)(int)uVar16;
    uVar36 = (long)psVar42 * (long)(int)uVar54 - (long)psVar55 * (long)psVar64;
    sStack_3a8.u = uVar21;
    sStack_3a8.v = uVar14;
    sStack_3a8.q = uVar16;
    sStack_3a8.r = uVar54;
    if (uVar36 != 0x40000000) {
LAB_0014b715:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b71a;
      secp256k1_modinv32_cold_3();
LAB_0014b71a:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b71f;
      secp256k1_modinv32_cold_15();
LAB_0014b71f:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b724;
      secp256k1_modinv32_cold_14();
LAB_0014b724:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b729;
      secp256k1_modinv32_cold_13();
LAB_0014b729:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b72e;
      secp256k1_modinv32_cold_12();
LAB_0014b72e:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b733;
      secp256k1_modinv32_cold_4();
LAB_0014b733:
      pcVar58 = (code *)psVar55;
      uVar14 = (uint)uVar36;
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b738;
      secp256k1_modinv32_cold_5();
LAB_0014b738:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b73d;
      secp256k1_modinv32_cold_11();
LAB_0014b73d:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b742;
      secp256k1_modinv32_cold_10();
LAB_0014b742:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b747;
      secp256k1_modinv32_cold_9();
LAB_0014b747:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b74c;
      secp256k1_modinv32_cold_8();
      goto LAB_0014b74c;
    }
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b43a;
    lStack_368 = (long)(int)uVar54;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_328,
               (secp256k1_modinv32_signed30 *)(auStack_328 + 0x24),&sStack_3a8,
               (secp256k1_modinv32_modinfo *)psStack_3c0);
    psVar31 = &sStack_398;
    uVar54 = 9;
    uVar36 = 0xffffffff;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b456;
    psVar43 = psVar31;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,-1);
    if (iVar15 < 1) goto LAB_0014b71a;
    uVar54 = 9;
    uVar36 = 1;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b475;
    psVar43 = psVar31;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,1);
    if (0 < iVar15) goto LAB_0014b71f;
    psVar31 = &sStack_358;
    uVar54 = 9;
    uVar36 = 0xffffffff;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b499;
    psVar43 = psVar31;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,-1);
    if (iVar15 < 1) goto LAB_0014b724;
    uVar54 = 9;
    uVar36 = 1;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b4b8;
    psVar43 = psVar31;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar31,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,1);
    pcVar58 = (code *)psStack_3c0;
    if (-1 < iVar15) goto LAB_0014b729;
    psVar31 = (secp256k1_modinv64_modinfo *)((long)psVar55 * uVar37 + (long)psVar42 * uStack_360);
    uVar36 = uStack_360;
    if (((ulong)psVar31 & 0x3ffffffe) != 0) goto LAB_0014b72e;
    uVar36 = uStack_360 * (long)psVar64;
    uVar37 = uVar37 * lStack_368 + uVar36;
    if ((uVar37 & 0x3fffffff) != 0) goto LAB_0014b733;
    uVar37 = (long)uVar37 >> 0x1e;
    psVar31 = (secp256k1_modinv64_modinfo *)((long)psVar31 >> 0x1e);
    lVar19 = 1;
    do {
      lVar29 = (long)*(int *)((long)sStack_398.modulus.v + lVar19 * 4);
      lVar24 = (long)*(int *)((long)sStack_358.modulus.v + lVar19 * 4);
      lVar26 = (long)(psVar31->modulus).v + lVar24 * (long)psVar55 + lVar29 * (long)psVar42;
      lVar29 = lVar24 * lStack_368 + lVar29 * (long)psVar64 + uVar37;
      *(uint *)((long)sStack_398.modulus.v + lVar19 * 4 + -4) = (uint)lVar26 & 0x3fffffff;
      *(uint *)((long)&uStack_360 + lVar19 * 4 + 4) = (uint)lVar29 & 0x3fffffff;
      lVar19 = lVar19 + 1;
      uVar37 = lVar29 >> 0x1e;
      psVar31 = (secp256k1_modinv64_modinfo *)(lVar26 >> 0x1e);
    } while (lVar19 != 9);
    sStack_358.modulus.v[4]._0_4_ = (undefined4)uVar37;
    psVar42 = &sStack_398;
    uVar54 = 9;
    uVar14 = 0xffffffff;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b58a;
    psVar43 = psVar42;
    sStack_398.modulus.v[4]._0_4_ = (int32_t)psVar31;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,-1);
    if (iVar15 < 1) goto LAB_0014b738;
    uVar54 = 9;
    uVar14 = 1;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b5a7;
    psVar43 = psVar42;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,9,
                        (secp256k1_modinv32_signed30 *)pcVar58,1);
    if (0 < iVar15) goto LAB_0014b73d;
    psVar42 = &sStack_358;
    uVar54 = 9;
    uVar14 = 0xffffffff;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b5c9;
    psVar43 = psVar42;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,9,
                        (secp256k1_modinv32_signed30 *)pcVar58,-1);
    if (iVar15 < 1) goto LAB_0014b742;
    uVar54 = 9;
    uVar14 = 1;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b5e6;
    psVar43 = psVar42;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,9,
                        (secp256k1_modinv32_signed30 *)pcVar58,1);
    if (-1 < iVar15) goto LAB_0014b747;
    iVar15 = iStack_3b4 + 1;
  } while (iVar15 != 0x14);
  psVar43 = &sStack_358;
  uVar54 = 9;
  uVar14 = 0;
  psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b615;
  iVar15 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar43,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar15 == 0) {
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b638;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_398,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar42 = (secp256k1_modinv64_modinfo *)sStack_398.modulus_inv62;
    if (iVar15 == 0) {
LAB_0014b6c0:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b6d5;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_328,(int32_t)psVar31,
                 (secp256k1_modinv32_modinfo *)pcVar58);
      *(undefined4 *)((psVar42->modulus).v + 4) = auStack_328._32_4_;
      (psVar42->modulus).v[2] = auStack_328._16_8_;
      (psVar42->modulus).v[3] = auStack_328._24_8_;
      (psVar42->modulus).v[0] = auStack_328._0_8_;
      (psVar42->modulus).v[1] = auStack_328._8_8_;
      return;
    }
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b65c;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_398,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar15 == 0) goto LAB_0014b6c0;
    uVar54 = 9;
    uVar14 = 0;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b676;
    psVar43 = psVar42;
    iVar15 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar42,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar15 == 0) {
      psVar43 = (secp256k1_modinv64_modinfo *)auStack_328;
      uVar54 = 9;
      uVar14 = 0;
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b699;
      iVar15 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar43,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar15 == 0) {
        psVar43 = &sStack_398;
        uVar54 = 9;
        uVar14 = 1;
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b6b8;
        iVar15 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar43,9,
                            (secp256k1_modinv32_signed30 *)pcVar58,1);
        if (iVar15 == 0) goto LAB_0014b6c0;
      }
    }
  }
  else {
LAB_0014b74c:
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x14b751;
    secp256k1_modinv32_cold_6();
  }
  psStack_3d0 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_420;
  piVar32 = (int *)(ulong)uVar14;
  pcStack_428 = (code *)0x14b776;
  psStack_3d8 = psVar31;
  psStack_3d0 = psVar42;
  secp256k1_modinv32_mul_30(&sStack_3fc,(secp256k1_modinv32_signed30 *)psVar43,uVar54,1);
  pcStack_428 = (code *)0x14b788;
  piVar52 = piVar32;
  psVar38 = a_00;
  secp256k1_modinv32_mul_30(&sStack_420,a_00,9,uVar14);
  lVar19 = 0;
  while ((uint)sStack_3fc.v[lVar19] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_420.v[lVar19]) goto LAB_0014b7da;
    lVar19 = lVar19 + 1;
    if (lVar19 == 8) {
      uVar14 = 8;
      while( true ) {
        if (sStack_3fc.v[uVar14] < sStack_420.v[uVar14]) {
          return;
        }
        if (sStack_420.v[uVar14] < sStack_3fc.v[uVar14]) break;
        bVar66 = uVar14 == 0;
        uVar14 = uVar14 - 1;
        if (bVar66) {
          return;
        }
      }
      return;
    }
  }
  pcStack_428 = (code *)0x14b7da;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014b7da:
  pcStack_428 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar15 = (int)a_01;
  piStack_450 = piVar32;
  uStack_448 = uVar34;
  psStack_440 = (secp256k1_modinv64_modinfo *)pcVar58;
  psStack_430 = psVar64;
  pcStack_428 = (code *)uVar37;
  if (iVar15 < 1) {
    psStack_460 = (secp256k1_modinv32_signed30 *)0x14b8cd;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014b8cd:
    iVar23 = (int)piVar52;
    psStack_460 = (secp256k1_modinv32_signed30 *)0x14b8d2;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar22 = piVar52[1];
    iVar4 = *piVar52;
    piVar32 = (int *)(long)psVar38->v[0];
    uVar36 = (long)*extraout_RDX * (long)iVar22 + (long)piVar32 * (long)iVar4;
    if ((uVar36 & 0x3fffffff) != 0) goto LAB_0014b8cd;
    iVar5 = piVar52[3];
    iVar23 = piVar52[2];
    piVar32 = (int *)((long)piVar32 * (long)iVar23);
    piVar52 = (int *)((long)*extraout_RDX * (long)iVar5 + (long)piVar32);
    if (((ulong)piVar52 & 0x3fffffff) == 0) {
      lVar29 = (long)piVar52 >> 0x1e;
      lVar19 = (long)uVar36 >> 0x1e;
      if (iVar15 != 1) {
        uVar34 = 1;
        do {
          lVar19 = (long)extraout_RDX[uVar34] * (long)iVar22 +
                   (long)psVar38->v[uVar34] * (long)iVar4 + lVar19;
          lVar29 = (long)extraout_RDX[uVar34] * (long)iVar5 +
                   (long)psVar38->v[uVar34] * (long)iVar23 + lVar29;
          psVar38->v[uVar34 - 1] = (uint)lVar19 & 0x3fffffff;
          extraout_RDX[uVar34 - 1] = (uint)lVar29 & 0x3fffffff;
          uVar34 = uVar34 + 1;
          lVar29 = lVar29 >> 0x1e;
          lVar19 = lVar19 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar34);
      }
      psVar38->v[(long)iVar15 + -1] = (int32_t)lVar19;
      extraout_RDX[(long)iVar15 + -1] = (int)lVar29;
      return;
    }
  }
  psStack_460 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar19 = 0;
  psStack_460 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar19 < extraout_EDX) {
      psStack_460 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_460->v + (long)psVar38->v[lVar19] * (long)iVar23);
    }
    a_01->v[lVar19] = (uint)psStack_460 & 0x3fffffff;
    psStack_460 = (secp256k1_modinv32_signed30 *)((long)psStack_460 >> 0x1e);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 8);
  if (8 < extraout_EDX) {
    psStack_460 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_460->v + (long)psVar38->v[8] * (long)iVar23);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_460;
  if (b == psStack_460) {
    a_01->v[8] = (int)psStack_460;
    return;
  }
  pcStack_468 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar14 = *extraout_RDX_00;
  psVar59 = (secp256k1_modinv32_signed30 *)(long)(int)uVar14;
  uVar47 = extraout_RDX_00[1];
  lVar19 = (long)(int)uVar47;
  uVar49 = extraout_RDX_00[2];
  psVar33 = (secp256k1_modinv32_signed30 *)(long)(int)uVar49;
  lStack_4a0 = (long)(int)extraout_RDX_00[3];
  psVar39 = (secp256k1_fe *)0x9;
  pcStack_4b0 = (code *)0x14b96c;
  a_02 = a_01;
  piStack_490 = piVar32;
  uStack_488 = uVar34;
  psStack_480 = (secp256k1_modinv64_modinfo *)pcVar58;
  psStack_470 = psVar64;
  pcStack_468 = (code *)uVar37;
  iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar15 < 1) {
    pcStack_4b0 = (code *)0x14bbd4;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bbd4:
    pcStack_4b0 = (code *)0x14bbd9;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bbd9:
    pcStack_4b0 = (code *)0x14bbde;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bbde:
    pcStack_4b0 = (code *)0x14bbe3;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bbe3:
    pcStack_4b0 = (code *)0x14bbe8;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bbe8:
    pcStack_4b0 = (code *)0x14bbed;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bbed:
    pcStack_4b0 = (code *)0x14bbf2;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bbf2:
    pcStack_4b0 = (code *)0x14bbf7;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar56 = b;
LAB_0014bbf7:
    pcStack_4b0 = (code *)0x14bbfc;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bbfc:
    pcStack_4b0 = (code *)0x14bc01;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bc01:
    pcStack_4b0 = (code *)0x14bc06;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x14b989;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar15) goto LAB_0014bbd4;
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x14b9a6;
    a_02 = psVar38;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar38,9,b,-2);
    if (iVar15 < 1) goto LAB_0014bbd9;
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x14b9c3;
    a_02 = psVar38;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar38,9,b,1);
    if (-1 < iVar15) goto LAB_0014bbde;
    psVar56 = (secp256k1_modinv32_signed30 *)-(long)psVar59;
    if (0 < (long)psVar59) {
      psVar56 = psVar59;
    }
    lVar29 = -lVar19;
    if (lVar19 < 1) {
      lVar29 = lVar19;
    }
    if (lVar29 + 0x40000000 < (long)psVar56) goto LAB_0014bbe3;
    psVar56 = (secp256k1_modinv32_signed30 *)-(long)psVar33;
    if (0 < (long)psVar33) {
      psVar56 = psVar33;
    }
    lVar29 = -lStack_4a0;
    if (lStack_4a0 < 1) {
      lVar29 = lStack_4a0;
    }
    if (lVar29 + 0x40000000 < (long)psVar56) goto LAB_0014bbe8;
    uVar54 = a_01->v[8] >> 0x1f;
    uVar16 = psVar38->v[8] >> 0x1f;
    psVar39 = (secp256k1_fe *)(ulong)uVar16;
    iVar15 = (uVar16 & uVar47) + (uVar54 & uVar14);
    a_02 = (secp256k1_modinv32_signed30 *)
           (psVar38->v[0] * lVar19 + (long)a_01->v[0] * (long)psVar59);
    lVar29 = (long)(int)(iVar15 - ((int)a_02 * b[1].v[0] + iVar15 & 0x3fffffffU));
    piVar25 = (int32_t *)((long)a_02->v + lVar29 * b->v[0]);
    if (((ulong)piVar25 & 0x3fffffff) != 0) goto LAB_0014bbed;
    lStack_498 = lVar29;
    iVar15 = (uVar16 & (uint)lStack_4a0) + (uVar54 & uVar49);
    lVar24 = psVar38->v[0] * lStack_4a0 + (long)a_01->v[0] * (long)psVar33;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar14 = iVar15 - (b[1].v[0] * (int)lVar24 + iVar15 & 0x3fffffffU);
    psVar39 = (secp256k1_fe *)(ulong)uVar14;
    uVar34 = (long)b->v[0] * (long)(int)uVar14 + lVar24;
    if ((uVar34 & 0x3fffffff) != 0) goto LAB_0014bbf2;
    lVar24 = (long)uVar34 >> 0x1e;
    lVar26 = (long)piVar25 >> 0x1e;
    lVar44 = 1;
    do {
      lVar26 = b->v[lVar44] * lVar29 + psVar38->v[lVar44] * lVar19 +
               (long)a_01->v[lVar44] * (long)psVar59 + lVar26;
      psVar56 = (secp256k1_modinv32_signed30 *)(psVar38->v[lVar44] * lStack_4a0);
      lVar24 = (long)psVar56->v +
               (long)a_01->v[lVar44] * (long)psVar33 + lVar24 +
               (long)b->v[lVar44] * (long)(int)uVar14;
      a_01->v[lVar44 + -1] = (uint)lVar26 & 0x3fffffff;
      psVar38->v[lVar44 + -1] = (uint)lVar24 & 0x3fffffff;
      lVar44 = lVar44 + 1;
      lVar24 = lVar24 >> 0x1e;
      lVar26 = lVar26 >> 0x1e;
    } while (lVar44 != 9);
    a_01->v[8] = (int32_t)lVar26;
    psVar38->v[8] = (int32_t)lVar24;
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x14bb6d;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar33 = psVar38;
    psVar59 = b;
    if (iVar15 < 1) goto LAB_0014bbf7;
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x14bb8a;
    a_02 = a_01;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar15) goto LAB_0014bbfc;
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x14bba3;
    a_02 = psVar38;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar38,9,b,-2);
    if (iVar15 < 1) goto LAB_0014bc01;
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x14bbbc;
    a_02 = psVar38;
    iVar15 = secp256k1_modinv32_mul_cmp_30(psVar38,9,b,1);
    if (iVar15 < 0) {
      return;
    }
  }
  pcStack_4b0 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_4b0 = (code *)lVar19;
  psStack_4b8 = a_01;
  psStack_4c0 = psVar38;
  psStack_4c8 = psVar59;
  psStack_4d0 = psVar56;
  psStack_4d8 = psVar33;
  uVar14 = a_02->v[0];
  uVar40 = (ulong)uVar14;
  uVar47 = a_02->v[3];
  uVar51 = (ulong)uVar47;
  uVar49 = a_02->v[4];
  uVar36 = (ulong)uVar49;
  uVar16 = a_02->v[5];
  uVar37 = (ulong)uVar16;
  psVar38 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar54 = a_02->v[7];
  uVar34 = (ulong)uVar54;
  iStack_4dc = a_02->v[8];
  lVar19 = 0;
  do {
    if (a_02->v[lVar19] < -0x3fffffff) {
      pcStack_518 = (code *)0x14bf54;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014bf54:
      pcStack_518 = (code *)0x14bf59;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014bf59;
    }
    if (0x3fffffff < a_02->v[lVar19]) goto LAB_0014bf54;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 9);
  uStack_4fc = (uint)psVar39;
  psVar39 = (secp256k1_fe *)0x9;
  pcStack_518 = (code *)0x14bc91;
  psVar38 = a_02;
  uStack_508 = a_02->v[1];
  uStack_504 = a_02->v[2];
  uStack_500 = a_02->v[6];
  psStack_4f8 = b_00;
  iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar15 < 1) {
LAB_0014bf59:
    pcStack_518 = (code *)0x14bf5e;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014bf5e:
    pcStack_518 = (code *)0x14bf63;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014bf63:
    pcStack_518 = (code *)0x14bf68;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014bf68:
    pcStack_518 = (code *)0x14bf6d;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_518 = (code *)0x14bcb0;
    psVar38 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_4f8,1);
    if (-1 < iVar15) goto LAB_0014bf5e;
    uVar21 = iStack_4dc >> 0x1f;
    uStack_4e0 = psStack_4f8->v[1];
    uVar57 = (uVar21 & uStack_4e0) + uStack_508;
    uStack_508 = psStack_4f8->v[2];
    uVar27 = (uVar21 & uStack_508) + uStack_504;
    uStack_504 = psStack_4f8->v[3];
    uStack_4e4 = psStack_4f8->v[4];
    uStack_4e8 = psStack_4f8->v[5];
    uStack_4ec = psStack_4f8->v[6];
    uVar28 = (uVar21 & uStack_4ec) + uStack_500;
    uStack_500 = psStack_4f8->v[7];
    uStack_50c = (int)uStack_4fc >> 0x1f;
    uStack_4fc = psStack_4f8->v[8];
    uVar62 = ((uVar21 & psStack_4f8->v[0]) + uVar14 ^ uStack_50c) - uStack_50c;
    uVar41 = ((int)uVar62 >> 0x1e) + ((uVar57 ^ uStack_50c) - uStack_50c);
    uVar57 = ((int)uVar41 >> 0x1e) + ((uVar27 ^ uStack_50c) - uStack_50c);
    uVar63 = ((int)uVar57 >> 0x1e) + (((uVar21 & uStack_504) + uVar47 ^ uStack_50c) - uStack_50c);
    uVar47 = ((int)uVar63 >> 0x1e) + (((uVar21 & uStack_4e4) + uVar49 ^ uStack_50c) - uStack_50c);
    uVar14 = ((int)uVar47 >> 0x1e) + (((uVar21 & uStack_4e8) + uVar16 ^ uStack_50c) - uStack_50c);
    uVar49 = ((int)uVar14 >> 0x1e) + ((uVar28 ^ uStack_50c) - uStack_50c);
    uVar16 = ((int)uVar49 >> 0x1e) + (((uVar21 & uStack_500) + uVar54 ^ uStack_50c) - uStack_50c);
    uVar60 = ((int)uVar16 >> 0x1e) +
             (((uVar21 & uStack_4fc) + iStack_4dc ^ uStack_50c) - uStack_50c);
    uVar37 = (ulong)uVar60;
    uStack_510 = (int)uVar60 >> 0x1f;
    uVar28 = (psStack_4f8->v[0] & uStack_510) + (uVar62 & 0x3fffffff);
    uVar27 = (uStack_4e8 & uStack_510) + (uVar14 & 0x3fffffff);
    uVar40 = (ulong)uVar27;
    uVar62 = (uStack_4ec & uStack_510) + (uVar49 & 0x3fffffff);
    uVar51 = (ulong)uVar62;
    uVar14 = ((int)uVar28 >> 0x1e) + (uStack_4e0 & uStack_510) + (uVar41 & 0x3fffffff);
    uVar49 = ((int)uVar14 >> 0x1e) + (uStack_508 & uStack_510) + (uVar57 & 0x3fffffff);
    uVar54 = ((int)uVar49 >> 0x1e) + (uStack_504 & uStack_510) + (uVar63 & 0x3fffffff);
    uVar21 = ((int)uVar54 >> 0x1e) + (uStack_4e4 & uStack_510) + (uVar47 & 0x3fffffff);
    uVar27 = ((int)uVar21 >> 0x1e) + uVar27;
    uVar62 = ((int)uVar27 >> 0x1e) + uVar62;
    uVar47 = ((int)uVar62 >> 0x1e) + (uStack_500 & uStack_510) + (uVar16 & 0x3fffffff);
    uVar16 = ((int)uVar47 >> 0x1e) + (uStack_4fc & uStack_510) + uVar60;
    uVar36 = (ulong)uVar16;
    uVar54 = uVar54 & 0x3fffffff;
    psVar39 = (secp256k1_fe *)(ulong)uVar54;
    uVar21 = uVar21 & 0x3fffffff;
    psVar38 = (secp256k1_modinv32_signed30 *)(ulong)uVar21;
    uVar47 = uVar47 & 0x3fffffff;
    uVar34 = (ulong)uVar47;
    a_02->v[0] = uVar28 & 0x3fffffff;
    a_02->v[1] = uVar14 & 0x3fffffff;
    a_02->v[2] = uVar49 & 0x3fffffff;
    a_02->v[3] = uVar54;
    a_02->v[4] = uVar21;
    a_02->v[5] = uVar27 & 0x3fffffff;
    a_02->v[6] = uVar62 & 0x3fffffff;
    a_02->v[7] = uVar47;
    a_02->v[8] = uVar16;
    if (0x3fffffff < uVar16) goto LAB_0014bf63;
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_518 = (code *)0x14bf21;
    psVar38 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_4f8,0);
    if (iVar15 < 0) goto LAB_0014bf68;
    psVar39 = (secp256k1_fe *)0x9;
    pcStack_518 = (code *)0x14bf3c;
    psVar38 = a_02;
    iVar15 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_4f8,1);
    if (iVar15 < 0) {
      return;
    }
  }
  pcStack_518 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_5b0 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_5b0 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_600 = (code *)0x14bfa9;
  uStack_540 = uVar34;
  uStack_538 = uVar37;
  uStack_530 = uVar51;
  psStack_528 = a_02;
  uStack_520 = uVar40;
  pcStack_518 = (code *)uVar36;
  (*(code *)psStack_5b0)(&sStack_5e8);
  if (psVar38 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar38->v + 8) = sStack_5e8.n[4];
    *(ulong *)(psVar38[1].v + 1) = CONCAT44(sStack_5e8.normalized,sStack_5e8.magnitude);
    *(uint64_t *)(psVar38->v + 4) = sStack_5e8.n[2];
    *(uint64_t *)(psVar38->v + 6) = sStack_5e8.n[3];
    *(uint64_t *)psVar38->v = sStack_5e8.n[0];
    *(uint64_t *)(psVar38->v + 2) = sStack_5e8.n[1];
  }
  uVar65 = 0xfffffffffffff;
  uVar18 = 0xf000000000000;
  uVar36 = 0xffffffffffff;
  uVar37 = 0x1000003d0;
  sStack_578.n[0] = psVar39->n[0];
  sStack_578.n[1] = psVar39->n[1];
  sStack_578.n[2] = psVar39->n[2];
  sStack_578.n[3] = psVar39->n[3];
  sStack_578.n[4] = psVar39->n[4];
  sStack_578.magnitude = psVar39->magnitude;
  sStack_578.normalized = psVar39->normalized;
  a_03 = &sStack_578;
  pcStack_600 = (code *)0x14c020;
  secp256k1_fe_verify(a_03);
  lStack_5f0 = 0x1000003d1;
  uVar34 = (sStack_578.n[4] >> 0x30) * 0x1000003d1 + sStack_578.n[0];
  if (((uVar34 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar34 & 0xfffffffffffff) == 0)) {
    uVar51 = (uVar34 >> 0x34) + sStack_578.n[1];
    uVar40 = (uVar51 >> 0x34) + sStack_578.n[2];
    uVar45 = (uVar40 >> 0x34) + sStack_578.n[3];
    uVar48 = (uVar45 >> 0x34) + (sStack_578.n[4] & 0xffffffffffff);
    if ((((uVar51 | uVar34 | uVar40 | uVar45) & 0xfffffffffffff) != 0 || uVar48 != 0) &&
       (((uVar34 | 0x1000003d0) & uVar51 & uVar40 & uVar45 & (uVar48 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c0c3;
LAB_0014c4d7:
    psVar39 = &sStack_5e8;
    pcStack_600 = (code *)0x14c4e4;
    secp256k1_fe_verify(psVar39);
    uVar36 = uVar36 & sStack_5e8.n[4];
    uVar34 = (sStack_5e8.n[4] >> 0x30) * lStack_5f0 + sStack_5e8.n[0];
    uVar51 = (uVar34 >> 0x34) + sStack_5e8.n[1];
    uVar40 = (uVar51 >> 0x34) + sStack_5e8.n[2];
    r = (secp256k1_fe *)((uVar40 >> 0x34) + sStack_5e8.n[3]);
    uVar45 = ((ulong)r >> 0x34) + uVar36;
    if ((((uVar51 | uVar34 | uVar40 | (ulong)r) & uVar65) == 0 && uVar45 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar45 ^ uVar18),
       ((uVar34 ^ uVar37) & uVar51 & uVar40 & (ulong)r & (ulong)r_00) == uVar65)) {
      return;
    }
  }
  else {
LAB_0014c0c3:
    pcStack_600 = (code *)0x14c0db;
    r = psVar39;
    secp256k1_fe_mul(&sStack_578,psVar39,&sStack_5e8);
    pcStack_600 = (code *)0x14c0e3;
    secp256k1_fe_verify(&sStack_578);
    r_00 = &fe_minus_one;
    pcStack_600 = (code *)0x14c0ef;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_578.magnitude < 0x20) {
      sStack_578.n[0] = sStack_578.n[0] + 0xffffefffffc2e;
      sStack_578.n[1] = sStack_578.n[1] + 0xfffffffffffff;
      sStack_578.n[2] = sStack_578.n[2] + 0xfffffffffffff;
      sStack_578.n[3] = sStack_578.n[3] + 0xfffffffffffff;
      sStack_578.n[4] = sStack_578.n[4] + 0xffffffffffff;
      sStack_578.normalized = 0;
      sStack_578.magnitude = sStack_578.magnitude + 1;
      pcStack_600 = (code *)0x14c144;
      secp256k1_fe_verify(&sStack_578);
      pcStack_600 = (code *)0x14c14c;
      secp256k1_fe_verify(&sStack_578);
      uVar34 = (sStack_578.n[4] >> 0x30) * lStack_5f0 + sStack_578.n[0];
      uVar36 = (uVar34 >> 0x34) + sStack_578.n[1];
      uVar51 = (uVar36 >> 0x34) + sStack_578.n[2];
      r = (secp256k1_fe *)((uVar51 >> 0x34) + sStack_578.n[3]);
      uVar40 = ((ulong)r >> 0x34) + (sStack_578.n[4] & 0xffffffffffff);
      if ((((uVar36 | uVar34 | uVar51 | (ulong)r) & 0xfffffffffffff) != 0 || uVar40 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar40 ^ 0xf000000000000),
         ((uVar34 ^ 0x1000003d0) & uVar36 & uVar51 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_0014c565;
      sStack_5a8.n[0] = psVar39->n[0];
      sStack_5a8.n[1] = psVar39->n[1];
      sStack_5a8.n[2] = psVar39->n[2];
      sStack_5a8.n[3] = psVar39->n[3];
      sStack_5a8.n[4] = psVar39->n[4];
      sStack_5a8.magnitude = psVar39->magnitude;
      sStack_5a8.normalized = psVar39->normalized;
      psVar39 = &sStack_5a8;
      pcStack_600 = (code *)0x14c1e4;
      secp256k1_fe_verify(psVar39);
      r_00 = &fe_minus_one;
      pcStack_600 = (code *)0x14c1f0;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_5a8.magnitude) goto LAB_0014c56a;
      uVar35 = sStack_5a8.n[0] + 0xffffefffffc2e;
      uVar61 = sStack_5a8.n[1] + 0xfffffffffffff;
      uVar65 = sStack_5a8.n[2] + 0xfffffffffffff;
      uVar18 = sStack_5a8.n[3] + 0xfffffffffffff;
      uVar37 = sStack_5a8.n[4] + 0xffffffffffff;
      sStack_5a8.normalized = 0;
      sStack_5a8.magnitude = sStack_5a8.magnitude + 1;
      pcStack_600 = (code *)0x14c265;
      sStack_5a8.n[0] = uVar35;
      sStack_5a8.n[1] = uVar61;
      sStack_5a8.n[2] = uVar65;
      sStack_5a8.n[3] = uVar18;
      sStack_5a8.n[4] = uVar37;
      secp256k1_fe_verify(&sStack_5a8);
      pcStack_600 = (code *)0x14c26d;
      secp256k1_fe_verify(&sStack_5a8);
      a_03 = psStack_5b0;
      uVar34 = (uVar37 >> 0x30) * lStack_5f0 + uVar35;
      if (((uVar34 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar34 & 0xfffffffffffff) == 0)) {
        uVar37 = uVar37 & 0xffffffffffff;
        uVar45 = uVar61 + (uVar34 >> 0x34);
        uVar36 = (uVar45 >> 0x34) + uVar65;
        uVar51 = (uVar36 >> 0x34) + uVar18;
        uVar40 = (uVar51 >> 0x34) + uVar37;
        if (((uVar45 | uVar34 | uVar36 | uVar51) & 0xfffffffffffff) == 0 && uVar40 == 0) {
          return;
        }
        if (((uVar34 | 0x1000003d0) & uVar45 & uVar36 & uVar51 & (uVar40 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r = &sStack_5a8;
      pcStack_600 = (code *)0x14c32d;
      (*(code *)psStack_5b0)();
      psVar39 = &sStack_5e8;
      pcStack_600 = (code *)0x14c33a;
      secp256k1_fe_verify(psVar39);
      r_00 = &fe_minus_one;
      pcStack_600 = (code *)0x14c346;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_5e8.magnitude) goto LAB_0014c56f;
      psVar39 = &sStack_5e8;
      sStack_5e8.n[0] = sStack_5e8.n[0] + 0xffffefffffc2e;
      sStack_5e8.n[1] = sStack_5e8.n[1] + 0xfffffffffffff;
      sStack_5e8.n[2] = sStack_5e8.n[2] + 0xfffffffffffff;
      sStack_5e8.n[3] = sStack_5e8.n[3] + 0xfffffffffffff;
      sStack_5e8.n[4] = sStack_5e8.n[4] + 0xffffffffffff;
      sStack_5e8.magnitude = sStack_5e8.magnitude + 1;
      uVar36 = 0;
      sStack_5e8.normalized = 0;
      pcStack_600 = (code *)0x14c38f;
      secp256k1_fe_verify(psVar39);
      pcStack_600 = (code *)0x14c398;
      r = psVar39;
      (*(code *)a_03)(psVar39);
      pcStack_600 = (code *)0x14c3a0;
      secp256k1_fe_verify(psVar39);
      sStack_5e8.n[0] = sStack_5e8.n[0] + 1;
      sStack_5e8.magnitude = sStack_5e8.magnitude + 1;
      sStack_5e8.normalized = 0;
      pcStack_600 = (code *)0x14c3b1;
      secp256k1_fe_verify(psVar39);
      pcStack_600 = (code *)0x14c3b9;
      secp256k1_fe_verify(psVar39);
      a_03 = &sStack_5a8;
      pcStack_600 = (code *)0x14c3c6;
      r_00 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_5a8.magnitude + sStack_5e8.magnitude < 0x21) {
        sStack_5e8.n[0] = sStack_5e8.n[0] + sStack_5a8.n[0];
        sStack_5e8.n[1] = sStack_5e8.n[1] + sStack_5a8.n[1];
        sStack_5e8.n[2] = sStack_5e8.n[2] + sStack_5a8.n[2];
        sStack_5e8.n[3] = sStack_5e8.n[3] + sStack_5a8.n[3];
        sStack_5e8.n[4] = sStack_5e8.n[4] + sStack_5a8.n[4];
        sStack_5e8.normalized = 0;
        pcStack_600 = (code *)0x14c414;
        sStack_5e8.magnitude = sStack_5a8.magnitude + sStack_5e8.magnitude;
        secp256k1_fe_verify(&sStack_5e8);
        pcStack_600 = (code *)0x14c41c;
        secp256k1_fe_verify(&sStack_5e8);
        uVar34 = (sStack_5e8.n[4] >> 0x30) * lStack_5f0 + sStack_5e8.n[0];
        if (((uVar34 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar34 & 0xfffffffffffff) == 0)) {
          uVar51 = (uVar34 >> 0x34) + sStack_5e8.n[1];
          uVar40 = (uVar51 >> 0x34) + sStack_5e8.n[2];
          uVar45 = (uVar40 >> 0x34) + sStack_5e8.n[3];
          uVar48 = (uVar45 >> 0x34) + (sStack_5e8.n[4] & 0xffffffffffff);
          if (((uVar51 | uVar34 | uVar40 | uVar45) & 0xfffffffffffff) == 0 && uVar48 == 0) {
            return;
          }
          if (((uVar34 | 0x1000003d0) & uVar51 & uVar40 & uVar45 & (uVar48 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_600 = (code *)0x14c4d7;
        test_inverse_field_cold_2();
        goto LAB_0014c4d7;
      }
    }
    else {
      pcStack_600 = (code *)0x14c565;
      test_inverse_field_cold_7();
LAB_0014c565:
      pcStack_600 = (code *)0x14c56a;
      test_inverse_field_cold_6();
LAB_0014c56a:
      a_03 = &sStack_578;
      pcStack_600 = (code *)0x14c56f;
      test_inverse_field_cold_5();
LAB_0014c56f:
      uVar36 = 0xffffffffffff;
      pcStack_600 = (code *)0x14c574;
      test_inverse_field_cold_4();
    }
    pcStack_600 = (code *)0x14c579;
    test_inverse_field_cold_3();
  }
  pcStack_600 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar46 = (secp256k1_fe *)auStack_670;
  pcVar58 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar58 = secp256k1_scalar_inverse;
  }
  pcStack_678 = (code *)0x14c5a7;
  auStack_630._32_8_ = psVar39;
  auStack_630._40_8_ = a_03;
  pcStack_600 = (code *)uVar65;
  (*pcVar58)(auStack_670);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_670._20_4_,auStack_670._16_4_);
    r_00->n[3] = CONCAT44(auStack_670._28_4_,auStack_670._24_4_);
    r_00->n[0] = CONCAT44(auStack_670._4_4_,auStack_670._0_4_);
    r_00->n[1] = CONCAT44(auStack_670._12_4_,auStack_670._8_4_);
  }
  pcStack_678 = (code *)0x14c5c6;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar67._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar67._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar67._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar67._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar15 = movmskps(extraout_EAX,auVar67);
  if (iVar15 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_630;
    pcStack_678 = (code *)0x14c5fa;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_670);
    pcStack_678 = (code *)0x14c602;
    psVar39 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_630._0_8_ != 1 || auStack_630._8_8_ != 0) || auStack_630._16_8_ != 0) ||
        auStack_630._24_8_ != 0) {
      pcStack_678 = (code *)0x14c70c;
      test_inverse_scalar_cold_1();
      goto LAB_0014c70c;
    }
    pcStack_678 = (code *)0x14c632;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_670 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_678 = (code *)0x14c63a;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_670 + 0x20));
    auVar68._0_4_ = -(uint)(iStack_640 == 0 && auStack_670._32_4_ == 0);
    auVar68._4_4_ = -(uint)(iStack_63c == 0 && iStack_64c == 0);
    auVar68._8_4_ = -(uint)(iStack_638 == 0 && iStack_648 == 0);
    auVar68._12_4_ = -(uint)(iStack_634 == 0 && iStack_644 == 0);
    iVar15 = movmskps(extraout_EAX_00,auVar68);
    if (iVar15 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_670 + 0x20);
    pcStack_678 = (code *)0x14c66b;
    (*pcVar58)(a,a);
    pcStack_678 = (code *)0x14c680;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_670,&scalar_minus_one,(secp256k1_scalar *)auStack_670);
    pcStack_678 = (code *)0x14c689;
    (*pcVar58)(auStack_670,auStack_670);
    pcStack_678 = (code *)0x14c69b;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_670,(secp256k1_scalar *)auStack_670,&secp256k1_scalar_one
              );
    pcStack_678 = (code *)0x14c6a9;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_670,a,(secp256k1_scalar *)auStack_670);
    pcStack_678 = (code *)0x14c6b1;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_670);
    auVar69._0_4_ = -(uint)(auStack_670._16_4_ == 0 && auStack_670._0_4_ == 0);
    auVar69._4_4_ = -(uint)(auStack_670._20_4_ == 0 && auStack_670._4_4_ == 0);
    auVar69._8_4_ = -(uint)(auStack_670._24_4_ == 0 && auStack_670._8_4_ == 0);
    auVar69._12_4_ = -(uint)(auStack_670._28_4_ == 0 && auStack_670._12_4_ == 0);
    iVar15 = movmskps(extraout_EAX_01,auVar69);
    if (iVar15 == 0xf) {
      return;
    }
    pcStack_678 = (code *)0x14c6d5;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_670;
  }
  pcStack_678 = (code *)0x14c6e0;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_670);
  auVar70._0_4_ = -(uint)(auStack_670._16_4_ == 0 && auStack_670._0_4_ == 0);
  auVar70._4_4_ = -(uint)(auStack_670._20_4_ == 0 && auStack_670._4_4_ == 0);
  auVar70._8_4_ = -(uint)(auStack_670._24_4_ == 0 && auStack_670._8_4_ == 0);
  auVar70._12_4_ = -(uint)(auStack_670._28_4_ == 0 && auStack_670._12_4_ == 0);
  iVar15 = movmskps(extraout_EAX_02,auVar70);
  r = (secp256k1_fe *)auStack_670;
  psVar39 = psVar46;
  if (iVar15 == 0xf) {
    return;
  }
LAB_0014c70c:
  pcStack_678 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1728;
  psStack_6a0 = r;
  uStack_698 = uVar37;
  uStack_690 = uVar18;
  psStack_688 = r_00;
  pcStack_680 = pcVar58;
  pcStack_678 = (code *)uVar36;
  memset(__s,0,0x1081);
  uStack_1738 = 0;
  lVar19 = 0x41;
  psStack_1730 = psVar39;
  secp256k1_hsort(__s,0x41,(size_t)psVar39,test_hsort_cmp,&uStack_1738);
  if (0x3f < uStack_1738) {
    test_hsort_is_sorted(auStack_1728,0x41,(size_t)psVar39);
    if (0 < COUNT) {
      iVar15 = 0;
      do {
        uVar17 = testrand_int(0x41);
        count = (size_t)(int)uVar17;
        testrand_bytes_test(auStack_1728,count * (long)psVar39);
        secp256k1_hsort(auStack_1728,count,(size_t)psVar39,test_hsort_cmp,&uStack_1738);
        test_hsort_is_sorted(auStack_1728,count,(size_t)psVar39);
        iVar15 = iVar15 + 1;
      } while (iVar15 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar29 = 0;
    do {
      if (__s[lVar29] != *(uchar *)(lVar19 + lVar29)) {
        return;
      }
      lVar29 = lVar29 + 1;
    } while (extraout_RDX_01[1] != lVar29);
  }
  return;
LAB_0014a883:
  pcStack_f0 = (code *)0x14a888;
  test_modinv64_uint16_cold_5();
LAB_0014a888:
  pcStack_f0 = (code *)0x14a88d;
  test_modinv64_uint16_cold_3();
LAB_0014a88d:
  pcStack_f0 = (code *)0x14a892;
  test_modinv64_uint16_cold_1();
  psVar31 = psVar42;
LAB_0014a892:
  psVar43 = psVar31;
  pcStack_f0 = (code *)0x14a897;
  test_modinv64_uint16_cold_6();
  goto LAB_0014a897;
}

Assistant:

static void test_modinv64_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    uint16_t tmp[16];
    secp256k1_modinv64_signed62 x;
    secp256k1_modinv64_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed62(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4]) != 0;
    uint16_to_signed62(&m.modulus, mod);

    /* compute 1/modulus mod 2^62 */
    m.modulus_inv62 = modinv2p64(m.modulus.v[0]) & M62;
    CHECK(((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1);

    /* Test secp256k1_jacobi64_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed62(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed62(&x, sqr);
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed62(&x, in);
    mutate_sign_signed62(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* produce output */
        signed62_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* check if the result is equal to the input */
        signed62_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}